

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

void __thiscall
csv::internals::
StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
::next(StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t bytes)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  pointer pcVar7;
  string *this_00;
  RawCSVDataPtr *this_01;
  undefined1 auVar8 [16];
  size_t remainder;
  CSVRow local_b8;
  string_view local_90;
  fpos local_80 [32];
  unique_ptr<char[],_std::default_delete<char[]>_> local_60;
  unique_ptr<char[],_std::default_delete<char[]>_> buff;
  size_t length;
  pos_type end;
  undefined8 local_38;
  pos_type start;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  size_t local_18;
  size_t bytes_local;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = bytes;
  bytes_local = (size_t)this;
  bVar2 = IBasicCSVParser::eof(&this->super_IBasicCSVParser);
  if (bVar2) {
    return;
  }
  IBasicCSVParser::reset_data_ptr(&this->super_IBasicCSVParser);
  std::make_shared<std::__cxx11::string>();
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_IBasicCSVParser).data_ptr);
  std::shared_ptr<void>::operator=(&peVar3->_data,&local_28);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(&local_28);
  if ((this->super_IBasicCSVParser).source_size == 0) {
    _local_38 = std::istream::tellg();
    std::istream::seekg((long)&this->_source,_S_beg);
    auVar8 = std::istream::tellg();
    _end = auVar8._8_8_;
    length = auVar8._0_8_;
    std::istream::seekg((long)&this->_source,_S_beg);
    sVar4 = std::fpos<__mbstate_t>::operator-
                      ((fpos<__mbstate_t> *)&length,(fpos<__mbstate_t> *)&stack0xffffffffffffffc8);
    (this->super_IBasicCSVParser).source_size = sVar4;
  }
  buff._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 ((this->super_IBasicCSVParser).source_size - this->stream_pos);
  puVar5 = std::min<unsigned_long>((unsigned_long *)&buff,&local_18);
  uVar1 = *puVar5;
  pcVar6 = (char *)operator_new__(uVar1);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&local_60,pcVar6);
  std::istream::seekg((long)&this->_source,(_Ios_Seekdir)this->stream_pos);
  pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_60);
  std::istream::read((char *)&this->_source,(long)pcVar7);
  local_80._0_16_ = std::istream::tellg();
  sVar4 = std::fpos::operator_cast_to_long(local_80);
  this->stream_pos = sVar4;
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_IBasicCSVParser).data_ptr);
  pcVar6 = (char *)std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)peVar3);
  pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_60);
  std::__cxx11::string::assign(pcVar6,(ulong)pcVar7);
  this_01 = &(this->super_IBasicCSVParser).data_ptr;
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  this_00 = (string *)
            std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)peVar3);
  local_90 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  peVar3 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  peVar3->data = local_90;
  std::shared_ptr<csv::internals::RawCSVData>::shared_ptr
            ((shared_ptr<csv::internals::RawCSVData> *)&remainder,this_01);
  CSVRow::CSVRow(&local_b8,(shared_ptr<csv::internals::RawCSVData> *)&remainder);
  CSVRow::operator=(&(this->super_IBasicCSVParser).current_row,&local_b8);
  CSVRow::~CSVRow(&local_b8);
  std::shared_ptr<csv::internals::RawCSVData>::~shared_ptr
            ((shared_ptr<csv::internals::RawCSVData> *)&remainder);
  sVar4 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
  if (this->stream_pos != (this->super_IBasicCSVParser).source_size) {
    bVar2 = IBasicCSVParser::no_chunk(&this->super_IBasicCSVParser);
    if (!bVar2) {
      this->stream_pos = this->stream_pos - (uVar1 - sVar4);
      goto LAB_001142d0;
    }
  }
  (this->super_IBasicCSVParser)._eof = true;
  IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
LAB_001142d0:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_60);
  return;
}

Assistant:

void next(size_t bytes = ITERATION_CHUNK_SIZE) override {
                if (this->eof()) return;

                this->reset_data_ptr();
                this->data_ptr->_data = std::make_shared<std::string>();

                if (source_size == 0) {
                    const auto start = _source.tellg();
                    _source.seekg(0, std::ios::end);
                    const auto end = _source.tellg();
                    _source.seekg(0, std::ios::beg);

                    source_size = end - start;
                }

                // Read data into buffer
                size_t length = std::min(source_size - stream_pos, bytes);
                std::unique_ptr<char[]> buff(new char[length]);
                _source.seekg(stream_pos, std::ios::beg);
                _source.read(buff.get(), length);
                stream_pos = _source.tellg();
                ((std::string*)(this->data_ptr->_data.get()))->assign(buff.get(), length);

                // Create string_view
                this->data_ptr->data = *((std::string*)this->data_ptr->_data.get());

                // Parse
                this->current_row = CSVRow(this->data_ptr);
                size_t remainder = this->parse();

                if (stream_pos == source_size || no_chunk()) {
                    this->_eof = true;
                    this->end_feed();
                }
                else {
                    this->stream_pos -= (length - remainder);
                }
            }